

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

void __thiscall jrtplib::RTPSession::~RTPSession(RTPSession *this)

{
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSession_0014eeb0;
  Destroy(this);
  if ((this->deletertprnd == true) && (this->rtprnd != (RTPRandom *)0x0)) {
    (*this->rtprnd->_vptr_RTPRandom[1])();
  }
  std::__cxx11::
  _List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::
  _M_clear(&(this->byepackets).
            super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
          );
  RTPCollisionList::~RTPCollisionList(&this->collisionlist);
  RTCPPacketBuilder::~RTCPPacketBuilder(&this->rtcpbuilder);
  RTCPScheduler::~RTCPScheduler(&this->rtcpsched);
  RTPPacketBuilder::~RTPPacketBuilder(&this->packetbuilder);
  RTPSources::~RTPSources(&(this->sources).super_RTPSources);
  return;
}

Assistant:

RTPSession::~RTPSession()
{
	Destroy();

	if (deletertprnd)
		delete rtprnd;
}